

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O0

void __thiscall QDial::mouseMoveEvent(QDial *this,QMouseEvent *e)

{
  bool bVar1;
  QDialPrivate *this_00;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QEvent *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QPoint *in_stack_00000008;
  QDialPrivate *in_stack_00000010;
  QDialPrivate *d;
  MouseButton in_stack_ffffffffffffffac;
  QSinglePointEvent *in_stack_ffffffffffffffb0;
  int position;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_c;
  long local_8;
  
  position = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QDial *)0x56b51f);
  QSinglePointEvent::buttons(in_stack_ffffffffffffffb0);
  __fd = 1;
  local_c.super_QFlagsStorage<Qt::MouseButton>.i =
       (QFlagsStorage<Qt::MouseButton>)
       QFlags<Qt::MouseButton>::operator&
                 ((QFlags<Qt::MouseButton> *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  bVar1 = QFlags<Qt::MouseButton>::operator!((QFlags<Qt::MouseButton> *)&local_c);
  if (bVar1) {
    QEvent::ignore(in_RSI);
  }
  else {
    QEvent::accept(in_RSI,__fd,__addr,in_RCX);
    this_00->field_0x298 = this_00->field_0x298 & 0xfb | 4;
    QSinglePointEvent::position((QSinglePointEvent *)0x56b599);
    QPointF::toPoint((QPointF *)this_00);
    QDialPrivate::valueFromPoint(in_stack_00000010,in_stack_00000008);
    QAbstractSlider::setSliderPosition((QAbstractSlider *)this_00,position);
    this_00->field_0x298 = this_00->field_0x298 & 0xfb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (!(e->buttons() & Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    d->doNotEmit = true;
    setSliderPosition(d->valueFromPoint(e->position().toPoint()));
    d->doNotEmit = false;
}